

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::SInt64Size(RepeatedField<long> *value)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)value->current_size_;
  if (value->current_size_ < 1) {
    uVar4 = uVar2;
  }
  sVar3 = 0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    sVar1 = SInt64Size(*(int64 *)((long)value->arena_or_elements_ + uVar2 * 8));
    sVar3 = sVar3 + sVar1;
  }
  return sVar3;
}

Assistant:

size_t WireFormatLite::SInt64Size(const RepeatedField<int64>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += SInt64Size(value.Get(i));
  }
  return out;
}